

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void init_me_luts_bd(int *bit16lut,int range,aom_bit_depth_t bit_depth)

{
  int i;
  long lVar1;
  double dVar2;
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    dVar2 = av1_convert_qindex_to_q((int)lVar1,range);
    bit16lut[lVar1] = (int)(dVar2 * 0.0418 + 2.4107);
  }
  return;
}

Assistant:

static void init_me_luts_bd(int *bit16lut, int range,
                            aom_bit_depth_t bit_depth) {
  int i;
  // Initialize the sad lut tables using a formulaic calculation for now.
  // This is to make it easier to resolve the impact of experimental changes
  // to the quantizer tables.
  for (i = 0; i < range; i++) {
    const double q = av1_convert_qindex_to_q(i, bit_depth);
    bit16lut[i] = (int)(0.0418 * q + 2.4107);
  }
}